

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::UnpackSnorm4x8Case::iterate(UnpackSnorm4x8Case *this)

{
  ShaderExecutor *pSVar1;
  UnpackSnorm4x8Case *pUVar2;
  deUint32 dVar3;
  ostream *poVar4;
  long lVar5;
  char *description;
  int iVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  undefined1 auVar10 [12];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  void *out;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputs;
  deUint32 u32_1;
  deUint32 u32_3;
  deUint32 u32_5;
  deUint32 u32_7;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> outputs;
  deUint32 u32;
  deUint32 u32_2;
  deUint32 u32_4;
  deUint32 u32_6;
  Random rnd;
  void *in;
  Hex<8UL> local_290;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_288;
  uint local_26c;
  uint local_268;
  uint local_264;
  UnpackSnorm4x8Case *local_260;
  long local_258;
  int local_250;
  float local_24c;
  float local_248;
  float local_244;
  float local_240;
  float local_23c;
  float local_238;
  float local_234;
  float local_230;
  float local_22c;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_228;
  ulong local_210;
  float local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  float local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  float local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  float local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  deRandom local_1c0;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  
  dVar3 = deStringHash((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_1c0,dVar3 ^ 0x776002);
  local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_228.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (&local_288,(iterator)0x0,(uint *)local_1b0);
  local_1b0._0_4_ = 0x7fff8000;
  if (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_288,
               (iterator)
               local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1b0);
  }
  else {
    *local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x7fff8000;
    local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1b0._0_4_ = 0x80007fff;
  if (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_288,
               (iterator)
               local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1b0);
  }
  else {
    *local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x80007fff;
    local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1b0._0_4_ = 0xffffffff;
  if (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_288,
               (iterator)
               local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1b0);
  }
  else {
    *local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0xffffffff;
    local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1b0._0_4_ = 0x1fffe;
  if (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_288,
               (iterator)
               local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1b0);
  }
  else {
    *local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x1fffe;
    local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  iVar6 = 0x5f;
  do {
    dVar3 = deRandom_getUint32(&local_1c0);
    local_1b0._0_4_ = dVar3;
    if (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_288,
                 (iterator)
                 local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)local_1b0);
    }
    else {
      *local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = dVar3;
      local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&local_228,
             (long)local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start >> 2);
  local_1b0 = (undefined1  [8])
              ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Executing shader for ",0x15);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," input values",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  local_1b0 = (undefined1  [8])
              local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_290.value =
       (deUint64)
       local_228.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (*((this->super_ShaderPackingFunctionCase).m_executor)->_vptr_ShaderExecutor[5])();
  pSVar1 = (this->super_ShaderPackingFunctionCase).m_executor;
  (*pSVar1->_vptr_ShaderExecutor[6])
            (pSVar1,(ulong)((long)local_288.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_288.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2,local_1b0,&local_290
            );
  local_210 = (ulong)((long)local_288.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2;
  local_260 = this;
  if ((int)local_210 < 1) {
    iVar6 = 0;
  }
  else {
    lVar5 = 0;
    lVar7 = 0xc;
    iVar6 = 0;
    do {
      uVar8 = *(pointer)((long)(qpTestLog **)
                               local_288.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar5 * 4);
      fVar11 = (float)((int)uVar8 >> 0x18) / 127.0;
      auVar10 = ZEXT812(0x3f800000);
      if (fVar11 <= 1.0) {
        auVar10._4_8_ = 0;
        auVar10._0_4_ = fVar11;
      }
      uStack_204 = 0;
      uStack_200 = auVar10._8_4_;
      local_208 = (float)(-(uint)(fVar11 < -1.0) & 0xbf800000 |
                         ~-(uint)(fVar11 < -1.0) & auVar10._0_4_);
      local_23c = *(float *)((long)(local_228.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar7);
      uStack_1fc = 0;
      local_26c = (int)local_23c - (int)local_208;
      if ((uint)local_23c < (uint)local_208) {
        local_26c = -((int)local_23c - (int)local_208);
      }
      fVar12 = (float)(int)(char)(uVar8 >> 0x10) / 127.0;
      fVar11 = 1.0;
      if (fVar12 <= 1.0) {
        fVar11 = fVar12;
      }
      uStack_1f4 = 0;
      fVar11 = (float)(-(uint)(fVar12 < -1.0) & 0xbf800000 | ~-(uint)(fVar12 < -1.0) & (uint)fVar11)
      ;
      local_238 = *(float *)((long)(local_228.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar7 + -4)
      ;
      uStack_1f0 = 0;
      uStack_1ec = 0;
      local_268 = (int)local_238 - (int)fVar11;
      if ((uint)local_238 < (uint)fVar11) {
        local_268 = -((int)local_238 - (int)fVar11);
      }
      fVar13 = (float)(int)(char)(uVar8 >> 8) / 127.0;
      fVar12 = 1.0;
      if (fVar13 <= 1.0) {
        fVar12 = fVar13;
      }
      fVar13 = (float)(-(uint)(fVar13 < -1.0) & 0xbf800000 | ~-(uint)(fVar13 < -1.0) & (uint)fVar12)
      ;
      local_230 = *(float *)((long)(local_228.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_data +
                            lVar7 + -0xc);
      local_234 = *(float *)((long)(local_228.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar7 + -8)
      ;
      uStack_1e4 = 0;
      uStack_1e0 = 0;
      uStack_1dc = 0;
      fVar14 = (float)(int)(char)uVar8 / 127.0;
      fVar12 = 1.0;
      if (fVar14 <= 1.0) {
        fVar12 = fVar14;
      }
      uStack_1d4 = 0;
      fVar12 = (float)(-(uint)(fVar14 < -1.0) & 0xbf800000 | ~-(uint)(fVar14 < -1.0) & (uint)fVar12)
      ;
      uStack_1d0 = 0;
      uStack_1cc = 0;
      local_264 = (int)local_234 - (int)fVar13;
      if ((uint)local_234 < (uint)fVar13) {
        local_264 = -((int)local_234 - (int)fVar13);
      }
      uVar8 = (int)local_230 - (int)fVar12;
      if ((uint)local_230 < (uint)fVar12) {
        uVar8 = -((int)local_230 - (int)fVar12);
      }
      local_258 = lVar5;
      local_22c = local_230;
      local_1f8 = fVar11;
      local_1e8 = fVar13;
      local_1d8 = fVar12;
      if (((1 < uVar8) || (1 < local_264)) || (1 < (local_268 | local_26c))) {
        if (iVar6 < 10) {
          local_1b0 = (undefined1  [8])
                      ((local_260->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log;
          local_250 = iVar6;
          local_24c = local_23c;
          local_248 = local_238;
          local_244 = local_234;
          local_240 = local_208;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ERROR: Mismatch in value ",0x19);
          std::ostream::operator<<((ostringstream *)local_1a8,(int)local_258);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"  expected unpackSnorm4x8(",0x1a);
          local_290.value =
               (deUint64)
               *(uint *)((long)(qpTestLog **)
                               local_288.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + local_258 * 4);
          tcu::Format::Hex<8UL>::toStream(&local_290,(ostream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,") = ",4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"vec4(",5);
          poVar4 = std::ostream::_M_insert<double>((double)local_1d8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," / ",3);
          local_290.value = (deUint64)(uint)fVar12;
          tcu::Format::Hex<8UL>::toStream(&local_290,poVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
          poVar4 = std::ostream::_M_insert<double>((double)local_1e8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," / ",3);
          local_290.value = (deUint64)(uint)fVar13;
          tcu::Format::Hex<8UL>::toStream(&local_290,poVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
          poVar4 = std::ostream::_M_insert<double>((double)local_1f8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," / ",3);
          local_290.value = (deUint64)(uint)fVar11;
          tcu::Format::Hex<8UL>::toStream(&local_290,poVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
          poVar4 = std::ostream::_M_insert<double>((double)local_208);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," / ",3);
          local_290.value = (deUint64)(uint)local_240;
          tcu::Format::Hex<8UL>::toStream(&local_290,poVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", got vec4(",0xb)
          ;
          poVar4 = std::ostream::_M_insert<double>((double)local_22c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," / ",3);
          local_290.value = (deUint64)(uint)local_230;
          tcu::Format::Hex<8UL>::toStream(&local_290,poVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
          poVar4 = std::ostream::_M_insert<double>((double)local_234);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," / ",3);
          local_290.value = (deUint64)(uint)local_244;
          tcu::Format::Hex<8UL>::toStream(&local_290,poVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
          poVar4 = std::ostream::_M_insert<double>((double)local_238);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," / ",3);
          local_290.value = (deUint64)(uint)local_248;
          tcu::Format::Hex<8UL>::toStream(&local_290,poVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
          poVar4 = std::ostream::_M_insert<double>((double)local_23c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," / ",3);
          local_290.value = (deUint64)(uint)local_24c;
          tcu::Format::Hex<8UL>::toStream(&local_290,poVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\n  ULP diffs = (",0x10);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"), max diff = ",0xe);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          iVar6 = local_250;
        }
        else if (iVar6 == 10) {
          local_1b0 = (undefined1  [8])
                      ((local_260->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"...",3);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        }
        iVar6 = iVar6 + 1;
      }
      lVar5 = local_258 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar5 < (int)((ulong)((long)local_288.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_288.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  pUVar2 = local_260;
  local_1b0 = (undefined1  [8])
              ((local_260->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
               super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  iVar9 = (int)local_210;
  std::ostream::operator<<((ostringstream *)local_1a8,iVar9 - iVar6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," / ",3);
  std::ostream::operator<<((ostringstream *)local_1a8,iVar9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  description = "Pass";
  if (iVar6 != 0) {
    description = "Result comparison failed";
  }
  tcu::TestContext::setTestResult
            ((pUVar2->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,(uint)(iVar6 != 0),description);
  if (local_228.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((TestLog *)
      local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (TestLog *)0x0) {
    operator_delete(local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const deUint32				maxDiff		= 1; // Rounding error.
		de::Random					rnd			(deStringHash(getName()) ^ 0x776002);
		std::vector<deUint32>		inputs;
		std::vector<tcu::Vec4>		outputs;

		inputs.push_back(0x00000000u);
		inputs.push_back(0x7fff8000u);
		inputs.push_back(0x80007fffu);
		inputs.push_back(0xffffffffu);
		inputs.push_back(0x0001fffeu);

		// Random values.
		for (int ndx = 0; ndx < 95; ndx++)
			inputs.push_back(rnd.getUint32());

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->useProgram();
			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deInt8	in0		= (deInt8)(deUint8)(inputs[valNdx] & 0xff);
				const deInt8	in1		= (deInt8)(deUint8)((inputs[valNdx] >> 8) & 0xff);
				const deInt8	in2		= (deInt8)(deUint8)((inputs[valNdx] >> 16) & 0xff);
				const deInt8	in3		= (deInt8)(deUint8)(inputs[valNdx] >> 24);
				const float		ref0	= de::clamp(float(in0) / 127.f, -1.0f, 1.0f);
				const float		ref1	= de::clamp(float(in1) / 127.f, -1.0f, 1.0f);
				const float		ref2	= de::clamp(float(in2) / 127.f, -1.0f, 1.0f);
				const float		ref3	= de::clamp(float(in3) / 127.f, -1.0f, 1.0f);
				const float		res0	= outputs[valNdx].x();
				const float		res1	= outputs[valNdx].y();
				const float		res2	= outputs[valNdx].z();
				const float		res3	= outputs[valNdx].w();

				const deUint32	diff0	= getUlpDiff(ref0, res0);
				const deUint32	diff1	= getUlpDiff(ref1, res1);
				const deUint32	diff2	= getUlpDiff(ref2, res2);
				const deUint32	diff3	= getUlpDiff(ref3, res3);

				if (diff0 > maxDiff || diff1 > maxDiff || diff2 > maxDiff || diff3 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx << ",\n"
															   << "  expected unpackSnorm4x8(" << tcu::toHex(inputs[valNdx]) << ") = "
															   << "vec4(" << HexFloat(ref0) << ", " << HexFloat(ref1) << ", " << HexFloat(ref2) << ", " << HexFloat(ref3) << ")"
															   << ", got vec4(" << HexFloat(res0) << ", " << HexFloat(res1) << ", " << HexFloat(res2) << ", " << HexFloat(res3) << ")"
															   << "\n  ULP diffs = (" << diff0 << ", " << diff1 << ", " << diff2 << ", " << diff3 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									numFailed == 0 ? "Pass"					: "Result comparison failed");
		}

		return STOP;
	}